

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_getpath(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  uv_fs_event_t *puVar6;
  long lVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t len;
  char buf [1024];
  size_t local_440;
  char local_438 [1032];
  
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar7 = 0;
  do {
    iVar2 = uv_fs_event_init(uVar3,&fs_event);
    if (iVar2 != 0) {
LAB_00151b28:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00151b2d;
    }
    local_440 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    if (iVar2 != -0x16) {
LAB_00151b23:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00151b28;
    }
    __s = *(char **)((long)&DAT_001c8ca0 + lVar7);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar2 != 0) {
LAB_00151b1e:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00151b23;
    }
    local_440 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != -0x69) {
LAB_00151b19:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00151b1e;
    }
    if (0x3ff < local_440) {
LAB_00151b14:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00151b19;
    }
    sVar4 = strlen(__s);
    if (sVar1 != sVar4 + 1) {
LAB_00151b0f:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00151b14;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != 0) {
LAB_00151b0a:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00151b0f;
    }
    sVar4 = strlen(__s);
    if (sVar1 != sVar4) {
LAB_00151b05:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00151b0a;
    }
    iVar2 = strcmp(local_438,__s);
    if (iVar2 != 0) {
LAB_00151b00:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00151b05;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_00151afb:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00151b00;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar3,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00151afb;
    }
    close_cb_called = 0;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x28);
  remove("watch_dir/");
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    return 0;
  }
LAB_00151b2d:
  run_test_fs_event_getpath_cold_12();
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar6 = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init(puVar6,&fs_event);
  if (iVar2 == 0) {
    puVar6 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0,in_R8,in_R9,uVar3);
    if (iVar2 == 0) goto LAB_00151c2a;
    puVar6 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 != 0) goto LAB_00151c2f;
    puVar6 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0,in_R8,in_R9,uVar3);
    if (iVar2 == 0) goto LAB_00151c34;
    puVar6 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar6 = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close(puVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00151c3e;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151c2a:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151c2f:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151c34:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151c3e:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar6,0);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_event_getpath) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned i;
  int r;
  char buf[1024];
  size_t len;
  const char* const watch_dir[] = {
    "watch_dir",
    "watch_dir/",
    "watch_dir///",
    "watch_dir/subfolder/..",
    "watch_dir//subfolder//..//",
  };

  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");


  for (i = 0; i < ARRAY_SIZE(watch_dir); i++) {
    r = uv_fs_event_init(loop, &fs_event);
    ASSERT(r == 0);
    len = sizeof buf;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_EINVAL);
    r = uv_fs_event_start(&fs_event, fail_cb, watch_dir[i], 0);
    ASSERT(r == 0);
    len = 0;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_ENOBUFS);
    ASSERT(len < sizeof buf); /* sanity check */
    ASSERT(len == strlen(watch_dir[i]) + 1);
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == 0);
    ASSERT(len == strlen(watch_dir[i]));
    ASSERT(strcmp(buf, watch_dir[i]) == 0);
    r = uv_fs_event_stop(&fs_event);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &fs_event, close_cb);

    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(close_cb_called == 1);
    close_cb_called = 0;
  }

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}